

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watch_list.h
# Opt level: O0

void watch_list_push(watch_list *wl,watcher w,uint is_bin)

{
  uint uVar1;
  watcher wVar2;
  watcher t;
  uint is_bin_local;
  watch_list *wl_local;
  watcher w_local;
  
  if (wl != (watch_list *)0x0) {
    if (wl->size == wl->cap) {
      watch_list_grow(wl);
    }
    uVar1 = wl->size;
    wl->size = uVar1 + 1;
    wl->watchers[uVar1] = w;
    if ((is_bin != 0) && (wl->n_bin < wl->size)) {
      wVar2 = wl->watchers[wl->n_bin];
      wl->watchers[wl->n_bin] = wl->watchers[wl->size - 1];
      wl->watchers[wl->size - 1] = wVar2;
      wl->n_bin = wl->n_bin + 1;
    }
    return;
  }
  __assert_fail("wl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                ,0x58,"void watch_list_push(struct watch_list *, struct watcher, unsigned int)");
}

Assistant:

static inline void watch_list_push(struct watch_list *wl, struct watcher w, unsigned is_bin)
{
    assert(wl);
    if (wl->size == wl->cap)
        watch_list_grow(wl);
    wl->watchers[wl->size++] = w;
    if (is_bin && wl->size > wl->n_bin) {
        stk_swap(struct watcher, wl->watchers[wl->n_bin], wl->watchers[wl->size - 1]);
        wl->n_bin++;
    }
}